

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::GetString
              (ScriptContext *scriptContext,JavascriptString *input,Var nonMatchValue,
              GroupInfo group)

{
  char16 *pcVar1;
  JavascriptString *pJVar2;
  
  switch(group.length) {
  case 0:
    pJVar2 = JavascriptLibrary::GetEmptyString
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    return pJVar2;
  case 1:
    pcVar1 = JavascriptString::GetString(input);
    pJVar2 = CharStringCache::GetStringForChar
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                         charStringCache,pcVar1[(ulong)group & 0xffffffff]);
    return pJVar2;
  case 2:
    pcVar1 = JavascriptString::GetString(input);
    nonMatchValue =
         ScriptContext::GetPropertyString2
                   (scriptContext,pcVar1[(ulong)group & 0xffffffff],pcVar1[group.offset + 1]);
    if ((PropertyString *)nonMatchValue == (PropertyString *)0x0) goto switchD_00be0c70_default;
switchD_00be0c70_caseD_ffffffff:
    return (PropertyString *)nonMatchValue;
  case 0xffffffff:
    goto switchD_00be0c70_caseD_ffffffff;
  default:
switchD_00be0c70_default:
    pJVar2 = SubString::New(input,group.offset,group.length);
    return pJVar2;
  }
}

Assistant:

Var RegexHelper::GetString(ScriptContext* scriptContext, JavascriptString* input, Var nonMatchValue, UnifiedRegex::GroupInfo group)
    {
        if (group.IsUndefined())
            return nonMatchValue;
        switch (group.length)
        {
        case 0:
            return scriptContext->GetLibrary()->GetEmptyString();
        case 1:
        {
            const char16* inputStr = input->GetString();
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(inputStr[group.offset]);
        }
        case 2:
        {
            const char16* inputStr = input->GetString();
            PropertyString* propString = scriptContext->GetPropertyString2(inputStr[group.offset], inputStr[group.offset + 1]);
            if (propString != 0)
                return propString;
            // fall-through for default
        }
        default:
            return SubString::New(input, group.offset, group.length);
        }
    }